

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_array_vector.cpp
# Opt level: O0

void vectorCreation(void)

{
  int local_4c;
  undefined1 local_48 [8];
  VectorXf V;
  undefined1 local_30 [8];
  VectorXf objv;
  RowVector2i objRowVector2i;
  Vector3f objVector3f;
  
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)&objRowVector2i);
  Eigen::Matrix<int,_1,_2,_1,_1,_2>::Matrix
            ((Matrix<int,_1,_2,_1,_1,_2> *)
             ((long)&objv.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows + 4));
  V.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 10;
  Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<float,__1,_1,_0,__1,_1> *)local_30,
             (int *)((long)&V.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows + 4));
  local_4c = 0x1e;
  Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<float,__1,_1,_0,__1,_1> *)local_48,&local_4c);
  Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_48);
  Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_30);
  return;
}

Assistant:

void vectorCreation() {
  // Vector3f is a fixed column vector of 3 floats:
  Eigen::Vector3f objVector3f;

  // RowVector2i is a fixed row vector of 3 integer:
  Eigen::RowVector2i objRowVector2i;

  // VectorXf is a column vector of size 10 floats:
  Eigen::VectorXf objv(10);

  // V is a dynamic-size vector of size 30, with allocated but currently
  // uninitialized coefficients.
  Eigen::VectorXf V(30);
}